

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

int mbedtls_ecp_tls_read_point
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *pt,uchar **buf,size_t buf_len)

{
  byte *buf_00;
  byte *pbVar1;
  int iVar2;
  ulong ilen;
  
  if (1 < buf_len) {
    pbVar1 = *buf;
    buf_00 = pbVar1 + 1;
    *buf = buf_00;
    ilen = (ulong)*pbVar1;
    if ((ilen != 0) && (ilen <= buf_len - 1)) {
      *buf = buf_00 + ilen;
      iVar2 = mbedtls_ecp_point_read_binary(grp,pt,buf_00,ilen);
      return iVar2;
    }
  }
  return -0x4f80;
}

Assistant:

int mbedtls_ecp_tls_read_point(const mbedtls_ecp_group *grp,
                               mbedtls_ecp_point *pt,
                               const unsigned char **buf, size_t buf_len)
{
    unsigned char data_len;
    const unsigned char *buf_start;
    /*
     * We must have at least two bytes (1 for length, at least one for data)
     */
    if (buf_len < 2) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    data_len = *(*buf)++;
    if (data_len < 1 || data_len > buf_len - 1) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    /*
     * Save buffer start for read_binary and update buf
     */
    buf_start = *buf;
    *buf += data_len;

    return mbedtls_ecp_point_read_binary(grp, pt, buf_start, data_len);
}